

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

bool __thiscall cmake::GetSuppressDevWarnings(cmake *this,cmMakefile *mf)

{
  cmState *this_00;
  bool bVar1;
  char *val;
  string local_30;
  
  if (mf == (cmMakefile *)0x0) {
    this_00 = this->State;
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
    val = cmState::GetCacheEntryValue(this_00,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    bVar1 = cmSystemTools::IsOn(val);
  }
  else {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS","");
    bVar1 = cmMakefile::IsOn(mf,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar1;
}

Assistant:

bool cmake::GetSuppressDevWarnings(cmMakefile const* mf)
{
  /*
   * The suppression CMake variable may be set in the CMake configuration file
   * itself, so we have to check what its set to in the makefile if we can.
   */
  if (mf)
    {
    return mf->IsOn("CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
    }
  else
    {
    const char* cacheEntryValue = this->State->GetCacheEntryValue(
      "CMAKE_SUPPRESS_DEVELOPER_WARNINGS");
    return cmSystemTools::IsOn(cacheEntryValue);
    }
}